

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::BufferRenderer::BufferRenderer
          (BufferRenderer *this,TestLog *log,RenderContext *renderContext)

{
  RenderContext *pRVar1;
  undefined *puVar2;
  bool bVar3;
  Profile PVar4;
  GLenum GVar5;
  deBool dVar6;
  ShaderProgram *pSVar7;
  TestError *this_00;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  ProgramSources local_348;
  ApiType local_278;
  undefined1 local_272;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  ProgramSources local_228;
  deUint32 local_158;
  undefined1 local_152;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_119;
  string local_118;
  ProgramSources local_f8;
  ApiType local_28;
  ApiType local_24;
  RenderContext *pRStack_20;
  ContextType ctxType;
  RenderContext *renderContext_local;
  TestLog *log_local;
  BufferRenderer *this_local;
  
  this->m_program = (ShaderProgram *)0x0;
  this->m_renderCtx = renderContext;
  this->m_coordBuffer = 0;
  this->m_indexBuffer = 0;
  this->m_vao = 0;
  pRStack_20 = renderContext;
  local_28.m_bits = (*renderContext->_vptr_RenderContext[2])();
  local_24.m_bits = local_28.m_bits;
  bVar3 = glu::isGLSLVersionSupported((ContextType)local_28.m_bits,GLSL_VERSION_300_ES);
  if (bVar3) {
    pSVar7 = (ShaderProgram *)operator_new(0xd0);
    puVar2 = s_vertexShaderGLES3;
    local_152 = 1;
    pRVar1 = this->m_renderCtx;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,puVar2,&local_119);
    puVar2 = s_fragmentShaderGLES3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,puVar2,&local_151);
    glu::makeVtxFragSources(&local_f8,&local_118,&local_150);
    glu::ShaderProgram::ShaderProgram(pSVar7,pRVar1,&local_f8);
    local_152 = 0;
    this->m_program = pSVar7;
    glu::ProgramSources::~ProgramSources(&local_f8);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
  }
  else {
    local_158 = local_24.m_bits;
    bVar3 = glu::isGLSLVersionSupported((ContextType)local_24.m_bits,GLSL_VERSION_100_ES);
    if (bVar3) {
      pSVar7 = (ShaderProgram *)operator_new(0xd0);
      puVar2 = s_vertexShaderGLES2;
      local_272 = 1;
      pRVar1 = this->m_renderCtx;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,puVar2,&local_249);
      puVar2 = s_fragmentShaderGLES2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,puVar2,&local_271);
      glu::makeVtxFragSources(&local_228,&local_248,&local_270);
      glu::ShaderProgram::ShaderProgram(pSVar7,pRVar1,&local_228);
      local_272 = 0;
      this->m_program = pSVar7;
      glu::ProgramSources::~ProgramSources(&local_228);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_271);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator(&local_249);
    }
    else {
      local_278.m_bits = local_24.m_bits;
      bVar3 = glu::isGLSLVersionSupported((ContextType)local_24.m_bits,GLSL_VERSION_330);
      if (bVar3) {
        pSVar7 = (ShaderProgram *)operator_new(0xd0);
        puVar2 = s_vertexShaderGL3;
        pRVar1 = this->m_renderCtx;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,puVar2,&local_369);
        puVar2 = s_fragmentShaderGL3;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,puVar2,&local_391);
        glu::makeVtxFragSources(&local_348,&local_368,&local_390);
        glu::ShaderProgram::ShaderProgram(pSVar7,pRVar1,&local_348);
        this->m_program = pSVar7;
        glu::ProgramSources::~ProgramSources(&local_348);
        std::__cxx11::string::~string((string *)&local_390);
        std::allocator<char>::~allocator(&local_391);
        std::__cxx11::string::~string((string *)&local_368);
        std::allocator<char>::~allocator(&local_369);
      }
    }
  }
  PVar4 = glu::ApiType::getProfile(&local_24);
  if (PVar4 == PROFILE_CORE) {
    do {
      glwGenVertexArrays(1,&this->m_vao);
      GVar5 = glwGetError();
      glu::checkError(GVar5,"glGenVertexArrays(1, &m_vao)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0x166);
      dVar6 = ::deGetFalse();
    } while (dVar6 != 0);
  }
  do {
    glwGenBuffers(1,&this->m_coordBuffer);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glGenBuffers(1, &m_coordBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0x168);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  do {
    glwBindBuffer(0x8892,this->m_coordBuffer);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glBindBuffer(GL_ARRAY_BUFFER, m_coordBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0x169);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  do {
    glwBufferData(0x8892,0x20,s_quadCoords,0x88e4);
    GVar5 = glwGetError();
    glu::checkError(GVar5,
                    "glBufferData(GL_ARRAY_BUFFER, sizeof(s_quadCoords), s_quadCoords, GL_STATIC_DRAW)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0x16a);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  do {
    glwGenBuffers(1,&this->m_indexBuffer);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glGenBuffers(1, &m_indexBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0x16c);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  do {
    glwBindBuffer(0x8893,this->m_indexBuffer);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0x16d);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  do {
    glwBufferData(0x8893,6,&s_quadIndices,0x88e4);
    GVar5 = glwGetError();
    glu::checkError(GVar5,
                    "glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(s_quadIndices), s_quadIndices, GL_STATIC_DRAW)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0x16e);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  bVar3 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar3) {
    glu::operator<<(log,this->m_program);
    do {
      dVar6 = ::deGetFalse();
      if ((dVar6 != 0) || (bVar3 = glu::ShaderProgram::isOk(this->m_program), !bVar3)) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Shader compilation failed","m_program->isOk()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                   ,0x173);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar6 = ::deGetFalse();
    } while (dVar6 != 0);
  }
  return;
}

Assistant:

BufferRenderer::BufferRenderer (tcu::TestLog& log, glu::RenderContext& renderContext)
	: m_program		(NULL)
	, m_renderCtx	(renderContext)
	, m_coordBuffer	(0)
	, m_indexBuffer	(0)
	, m_vao			(0)
{
	const glu::ContextType ctxType = renderContext.getType();

	if (glu::isGLSLVersionSupported(ctxType, glu::GLSL_VERSION_300_ES))
		m_program = new glu::ShaderProgram(m_renderCtx, glu::makeVtxFragSources(s_vertexShaderGLES3, s_fragmentShaderGLES3));
	else if (glu::isGLSLVersionSupported(ctxType, glu::GLSL_VERSION_100_ES))
		m_program = new glu::ShaderProgram(m_renderCtx, glu::makeVtxFragSources(s_vertexShaderGLES2, s_fragmentShaderGLES2));
	else if (glu::isGLSLVersionSupported(ctxType, glu::GLSL_VERSION_330))
		m_program = new glu::ShaderProgram(m_renderCtx, glu::makeVtxFragSources(s_vertexShaderGL3, s_fragmentShaderGL3));
	else
		DE_ASSERT(false);

	if (ctxType.getProfile() == glu::PROFILE_CORE)
		GLU_CHECK_CALL(glGenVertexArrays(1, &m_vao));

	GLU_CHECK_CALL(glGenBuffers(1, &m_coordBuffer));
	GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, m_coordBuffer));
	GLU_CHECK_CALL(glBufferData(GL_ARRAY_BUFFER, sizeof(s_quadCoords), s_quadCoords, GL_STATIC_DRAW));

	GLU_CHECK_CALL(glGenBuffers(1, &m_indexBuffer));
	GLU_CHECK_CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer));
	GLU_CHECK_CALL(glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(s_quadIndices), s_quadIndices, GL_STATIC_DRAW));

	if (!m_program->isOk())
	{
		log << *m_program;
		TCU_CHECK_MSG(m_program->isOk(), "Shader compilation failed");
	}
}